

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePaddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint uVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  LayerUnion LVar4;
  BorderAmounts *pBVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  size_type *psVar9;
  ulong *puVar10;
  ulong uVar11;
  uint __len;
  string err;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  undefined1 local_e8 [24];
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_f8,layer,1,1);
  __return_storage_ptr__->m_type = local_f8._0_4_;
  __return_storage_ptr__->m_reason = local_f8._4_4_;
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
  if (local_f0._M_p != local_e8 + 8) {
    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    validateOutputCount((Result *)local_f8,layer,1,1);
    __return_storage_ptr__->m_type = local_f8._0_4_;
    __return_storage_ptr__->m_reason = local_f8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Padding","");
    validateInputOutputRankEquality((Result *)local_f8,layer,&local_70,&this->blobNameToRank);
    __return_storage_ptr__->m_type = local_f8._0_4_;
    __return_storage_ptr__->m_reason = local_f8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Padding","");
    validateRankCount((Result *)local_f8,layer,&local_d0,2,-1,&this->blobNameToRank);
    __return_storage_ptr__->m_type = local_f8._0_4_;
    __return_storage_ptr__->m_reason = local_f8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 200) {
    LVar4 = layer->layer_;
  }
  else {
    LVar4.padding_ = Specification::PaddingLayerParams::default_instance();
  }
  pBVar5 = (BorderAmounts *)((LVar4.activation_)->NonlinearityType_).linear_;
  if (pBVar5 == (BorderAmounts *)0x0) {
    pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
  }
  if (((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.current_size_ & 0xfffffffdU) == 0) {
    if ((LVar4.lrn_)->_cached_size_ != 0) {
      return __return_storage_ptr__;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "Padding layer ",(layer->name_).ptr_);
    plVar6 = (long *)std::__cxx11::string::append(local_f8);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar6[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_f8 != (undefined1  [8])local_e8) {
      operator_delete((void *)local_f8,local_e8._0_8_ + 1);
    }
    Result::Result((Result *)local_f8,INVALID_MODEL_PARAMETERS,&local_d0);
    goto LAB_00527239;
  }
  std::operator+(&local_50,"Padding layer ",(layer->name_).ptr_);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = &local_a0;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_a0 = *puVar10;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar10;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pBVar5 = (BorderAmounts *)((LVar4.activation_)->NonlinearityType_).linear_;
  if (pBVar5 == (BorderAmounts *)0x0) {
    pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
  }
  uVar1 = (pBVar5->borderamounts_).super_RepeatedPtrFieldBase.current_size_;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_00527087;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_00527087;
      }
      if (uVar8 < 10000) goto LAB_00527087;
      uVar11 = uVar11 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_00527087:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_90),__len,__val);
  uVar11 = 0xf;
  if (local_b0 != &local_a0) {
    uVar11 = local_a0;
  }
  if (uVar11 < (ulong)(local_88 + local_a8)) {
    uVar11 = 0xf;
    if (local_90 != local_80) {
      uVar11 = local_80[0];
    }
    if (uVar11 < (ulong)(local_88 + local_a8)) goto LAB_00527106;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_00527106:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
  }
  local_f8 = (undefined1  [8])local_e8;
  psVar9 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar9) {
    local_e8._0_8_ = *psVar9;
    local_e8._8_8_ = puVar7[3];
  }
  else {
    local_e8._0_8_ = *psVar9;
    local_f8 = (undefined1  [8])*puVar7;
  }
  local_f0._M_p = (pointer)puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append(local_f8);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_d0._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if (local_f8 != (undefined1  [8])local_e8) {
    operator_delete((void *)local_f8,local_e8._0_8_ + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Result::Result((Result *)local_f8,INVALID_MODEL_PARAMETERS,&local_d0);
LAB_00527239:
  __return_storage_ptr__->m_type = local_f8._0_4_;
  __return_storage_ptr__->m_reason = local_f8._4_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_f0);
  if (local_f0._M_p != local_e8 + 8) {
    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePaddingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Padding", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Padding", 2, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.padding();
    if (!(params.paddingamounts().borderamounts_size() == 0
          || params.paddingamounts().borderamounts_size() == 2)) {
        std::string err = "Padding layer " + layer.name() + " specifies " + std::to_string(params.paddingamounts().borderamounts_size()) + " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (params.PaddingType_case() == Specification::PaddingLayerParams::PaddingTypeCase::PADDINGTYPE_NOT_SET) {
        std::string err = "Padding layer " + layer.name() + " padding type is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}